

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShrU
          (I64ToI32Lowering *this,Index highBits,Index leftHigh,Index shift)

{
  Index IVar1;
  pointer this_00;
  pointer pBVar2;
  pointer pBVar3;
  Const *value;
  LocalSet *any;
  LocalGet *left;
  LocalGet *right;
  Binary *append;
  Block *pBVar4;
  Type local_30;
  Type local_28;
  Index local_1c;
  Index local_18;
  Index shift_local;
  Index leftHigh_local;
  Index highBits_local;
  I64ToI32Lowering *this_local;
  
  local_1c = shift;
  local_18 = leftHigh;
  shift_local = highBits;
  _leftHigh_local = this;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shift_local;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  value = Builder::makeConst<int>(pBVar3,0);
  any = Builder::makeLocalSet(pBVar2,IVar1,(Expression *)value);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_18;
  wasm::Type::Type(&local_28,i32);
  left = Builder::makeLocalGet(pBVar3,IVar1,local_28);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_1c;
  wasm::Type::Type(&local_30,i32);
  right = Builder::makeLocalGet(pBVar3,IVar1,local_30);
  append = Builder::makeBinary(pBVar2,ShrUInt32,(Expression *)left,(Expression *)right);
  pBVar4 = Builder::blockify(this_00,(Expression *)any,(Expression *)append);
  return pBVar4;
}

Assistant:

Block* makeLargeShrU(Index highBits, Index leftHigh, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(highBits, builder->makeConst(int32_t(0))),
      builder->makeBinary(ShrUInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }